

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O1

int cd_attribute_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  coda_type_record_field *pcVar6;
  char **ppcVar7;
  char *real_name;
  
  pcVar4 = *attr;
  if (pcVar4 != (char *)0x0) {
    ppcVar7 = attr + 2;
    pcVar5 = pcVar4;
    do {
      iVar2 = strcmp(pcVar5,"format");
      if (iVar2 == 0) {
        if (ppcVar7[-1] != (char *)0x0) {
          pcVar4 = "attribute \'format\' not allowed for Attribute";
          goto LAB_00156b92;
        }
        break;
      }
      pcVar5 = *ppcVar7;
      ppcVar7 = ppcVar7 + 2;
    } while (pcVar5 != (char *)0x0);
  }
  pnVar1 = info->node;
  if (pnVar1->parent->format_set == 0) {
    __assert_fail("info->node->parent->format_set",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                  ,0x5a4,"int cd_attribute_init(parser_info *, const char **)");
  }
  pnVar1->format = pnVar1->parent->format;
  pnVar1->format_set = 1;
  if (pcVar4 != (char *)0x0) {
    ppcVar7 = attr + 2;
    do {
      iVar2 = strcmp(pcVar4,"namexml");
      if (iVar2 == 0) {
        if (ppcVar7[-1] != (char *)0x0) {
          pcVar4 = "attribute \'namexml\' not allowed for Attribute";
LAB_00156b92:
          coda_set_error(-400,pcVar4);
          return -1;
        }
        break;
      }
      pcVar4 = *ppcVar7;
      ppcVar7 = ppcVar7 + 2;
    } while (pcVar4 != (char *)0x0);
  }
  pcVar4 = get_mandatory_attribute_value(attr,"name",pnVar1->tag);
  iVar2 = -1;
  if (pcVar4 != (char *)0x0) {
    pcVar5 = *attr;
    if (pcVar5 == (char *)0x0) {
      real_name = (char *)0x0;
    }
    else {
      ppcVar7 = attr + 2;
      real_name = (char *)0x0;
      do {
        iVar3 = strcmp(pcVar5,"real_name");
        if (iVar3 == 0) {
          real_name = ppcVar7[-1];
          break;
        }
        pcVar5 = *ppcVar7;
        ppcVar7 = ppcVar7 + 2;
      } while (pcVar5 != (char *)0x0);
    }
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_record_field_delete;
    if ((pnVar1->format == coda_format_xml) && (real_name == (char *)0x0)) {
      pcVar5 = coda_element_name_from_xml_name(pcVar4);
      pcVar5 = coda_identifier_from_name(pcVar5,(hashtable *)0x0);
      if (pcVar5 == (char *)0x0) {
        return -1;
      }
      pcVar6 = coda_type_record_field_new(pcVar5);
      info->node->data = pcVar6;
      free(pcVar5);
      real_name = pcVar4;
    }
    else {
      pcVar6 = coda_type_record_field_new(pcVar4);
      info->node->data = pcVar6;
    }
    pcVar6 = (coda_type_record_field *)info->node->data;
    if ((pcVar6 != (coda_type_record_field *)0x0) &&
       ((real_name == (char *)0x0 ||
        (iVar3 = coda_type_record_field_set_real_name(pcVar6,real_name), iVar3 == 0)))) {
      register_type_elements(info->node,cd_field_set_type);
      pnVar1 = info->node;
      pnVar1->init_sub_element[0x12] = dummy_init;
      pnVar1->add_element_to_parent[0x12] = cd_field_set_hidden;
      pnVar1 = info->node;
      pnVar1->init_sub_element[0x1d] = dummy_init;
      pnVar1->add_element_to_parent[0x1d] = cd_field_set_optional;
      pnVar1 = info->node;
      pnVar1->init_sub_element[5] = bool_expression_init;
      pnVar1->add_element_to_parent[5] = cd_field_set_available;
      pnVar1 = info->node;
      pnVar1->init_sub_element[0x10] = string_data_init;
      pnVar1->add_element_to_parent[0x10] = cd_attribute_set_fixed_value;
      info->node->finalise_element = cd_attribute_finalise;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int cd_attribute_init(parser_info *info, const char **attr)
{
    const char *format = NULL;
    const char *name = NULL;
    const char *real_name = NULL;

    format = get_attribute_value(attr, "format");
    if (format != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'format' not allowed for Attribute");
        return -1;
    }
    assert(info->node->parent->format_set);
    info->node->format = info->node->parent->format;
    info->node->format_set = 1;
    if (get_attribute_value(attr, "namexml") != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'namexml' not allowed for Attribute");
        return -1;
    }
    name = get_mandatory_attribute_value(attr, "name", info->node->tag);
    if (name == NULL)
    {
        return -1;
    }
    real_name = get_attribute_value(attr, "real_name");
    info->node->free_data = (free_data_handler)coda_type_record_field_delete;
    if (info->node->format == coda_format_xml && real_name == NULL)
    {
        char *field_name;

        /* still allow the old approach where 'name' could be the xml name of the attribute */
        real_name = name;
        field_name = coda_identifier_from_name(coda_element_name_from_xml_name(name), NULL);
        if (field_name == NULL)
        {
            return -1;
        }
        info->node->data = coda_type_record_field_new(field_name);
        free(field_name);
    }
    else
    {
        info->node->data = coda_type_record_field_new(name);
    }
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (real_name != NULL)
    {
        if (coda_type_record_field_set_real_name((coda_type_record_field *)info->node->data, real_name) != 0)
        {
            return -1;
        }
    }

    register_type_elements(info->node, cd_field_set_type);
    register_sub_element(info->node, element_cd_hidden, dummy_init, cd_field_set_hidden);
    register_sub_element(info->node, element_cd_optional, dummy_init, cd_field_set_optional);
    register_sub_element(info->node, element_cd_available, bool_expression_init, cd_field_set_available);
    register_sub_element(info->node, element_cd_fixed_value, string_data_init, cd_attribute_set_fixed_value);
    info->node->finalise_element = cd_attribute_finalise;

    return 0;
}